

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O1

bool __thiscall QCommandLineParser::addOption(QCommandLineParser *this,QCommandLineOption *option)

{
  Data<QHashPrivate::Node<QString,_long_long>_> *this_00;
  Node<QString,_long_long> *pNVar1;
  bool bVar2;
  long lVar3;
  QString *name_1;
  QString *pQVar4;
  QString *name;
  QList<QCommandLineOption> *this_01;
  long in_FS_OFFSET;
  qsizetype offset;
  long local_50;
  QArrayDataPointer<QString> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QCommandLineOption::names((QStringList *)&local_48,option);
  if ((undefined1 *)local_48.size == (undefined1 *)0x0) {
LAB_0016822f:
    bVar2 = false;
  }
  else {
    lVar3 = local_48.size * 0x18;
    pQVar4 = local_48.ptr;
    do {
      this_00 = (this->d->nameHash).d;
      if (this_00 != (Data<QHashPrivate::Node<QString,_long_long>_> *)0x0) {
        pNVar1 = QHashPrivate::Data<QHashPrivate::Node<QString,_long_long>_>::findNode<QString>
                           (this_00,pQVar4);
        if (pNVar1 != (Node<QString,_long_long> *)0x0) goto LAB_0016822f;
      }
      pQVar4 = pQVar4 + 1;
      lVar3 = lVar3 + -0x18;
    } while (lVar3 != 0);
    this_01 = &this->d->commandLineOptionList;
    QtPrivate::QMovableArrayOps<QCommandLineOption>::emplace<QCommandLineOption_const&>
              ((QMovableArrayOps<QCommandLineOption> *)this_01,
               (this->d->commandLineOptionList).d.size,option);
    QList<QCommandLineOption>::end(this_01);
    local_50 = (this->d->commandLineOptionList).d.size + -1;
    if ((undefined1 *)local_48.size != (undefined1 *)0x0) {
      lVar3 = local_48.size * 0x18;
      pQVar4 = local_48.ptr;
      do {
        QHash<QString,long_long>::emplace<long_long_const&>
                  ((QHash<QString,long_long> *)&this->d->nameHash,pQVar4,&local_50);
        pQVar4 = pQVar4 + 1;
        lVar3 = lVar3 + -0x18;
      } while (lVar3 != 0);
    }
    bVar2 = true;
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QCommandLineParser::addOption(const QCommandLineOption &option)
{
    const QStringList optionNames = option.names();

    if (!optionNames.isEmpty()) {
        for (const QString &name : optionNames) {
            if (d->nameHash.contains(name)) {
                qWarning("QCommandLineParser: option already added: \"%ls\"", qUtf16Printable(name));
                return false;
            }
        }

        d->commandLineOptionList.append(option);

        const qsizetype offset = d->commandLineOptionList.size() - 1;
        for (const QString &name : optionNames)
            d->nameHash.insert(name, offset);

        return true;
    }

    return false;
}